

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-run.c
# Opt level: O3

ztresult_t
zt_run_statements(ztast_statement_t *statements,ztstruct_t *meta,ztregion_t *regions,int nregions,
                 ztloader_t **loaders,int nloaders,void *structure,char *errbuf)

{
  uint uVar1;
  ztast_value_type zVar2;
  int iVar3;
  ztast_assignment *pzVar4;
  ztast_id *__s2;
  ztfield_t *pzVar5;
  ztast_expr *pzVar6;
  ztast_value *pzVar7;
  int *piVar8;
  int iVar9;
  ztast_value_data zVar10;
  ztresult_t zVar11;
  ulong uVar12;
  ulong uVar13;
  void *pvVar14;
  undefined8 uVar15;
  ztarray *pzVar16;
  ztregion_t *pzVar17;
  size_t sVar18;
  ztstruct *meta_00;
  long lVar19;
  long lVar20;
  ztast_value zVar21;
  long lVar22;
  undefined4 in_register_0000008c;
  long lVar23;
  ulong uVar24;
  char **ppcVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  char *in_stack_ffffffffffffff90;
  
  lVar23 = CONCAT44(in_register_0000008c,nloaders);
  if (statements != (ztast_statement_t *)0x0) {
    do {
      if (statements->type != ZTSTMT_ASSIGNMENT) goto LAB_0010200e;
      pzVar4 = (statements->u).assignment;
      uVar1 = meta->nfields;
      if ((int)uVar1 < 1) {
        uVar24 = 0;
LAB_001018fe:
        if ((uint)uVar24 == uVar1) goto LAB_00101903;
      }
      else {
        __s2 = pzVar4->id;
        ppcVar25 = &meta->fields->name;
        uVar24 = 0;
        do {
          iVar9 = strcmp(*ppcVar25,__s2->name);
          if (iVar9 == 0) goto LAB_001018fe;
          uVar24 = uVar24 + 1;
          ppcVar25 = ppcVar25 + 9;
        } while (uVar1 != uVar24);
        uVar24 = (ulong)uVar1;
LAB_00101903:
        *(undefined8 *)((long)structure + 6) = 0x646c656966206e;
        *(undefined8 *)structure = 0x206e776f6e6b6e75;
      }
      pzVar5 = meta->fields;
      uVar24 = uVar24 & 0xffffffff;
      switch(pzVar5[uVar24].type) {
      case zttype_uchar:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_VALUE) {
LAB_00102067:
            *(undefined8 *)structure = 0x79742065756c6176;
            builtin_strncpy((char *)((long)structure + 8),"pe requi",8);
            *(undefined4 *)((long)structure + 0x10) = 0x646572;
            return 0x30;
          }
          if (((pzVar6->data).value)->type != ZTVAL_INTEGER) {
LAB_00102099:
            uVar26._0_1_ = 'i';
            uVar26._1_1_ = 'n';
            uVar26._2_1_ = 't';
            uVar26._3_1_ = 'e';
            uVar27._0_1_ = 'g';
            uVar27._1_1_ = 'e';
            uVar27._2_1_ = 'r';
            uVar27._3_1_ = ' ';
            goto LAB_001020df;
          }
          uVar1 = (((pzVar6->data).value)->data).integer;
          if (0xff < uVar1) {
LAB_00102029:
            builtin_strncpy((char *)((long)structure + 0x10),"geunknow",8);
            builtin_strncpy((char *)((long)structure + 0x18),"n error",8);
            *(undefined8 *)structure = 0x756f2065756c6176;
            builtin_strncpy((char *)((long)structure + 8),"t of ran",8);
            return 0x30;
          }
          *(char *)(lVar23 + pzVar5[uVar24].offset) = (char)uVar1;
        }
        else {
          if (pzVar6->type != ZTEXPR_INTARRAY) {
LAB_0010207d:
            *(undefined8 *)structure = 0x2072656765746e69;
            builtin_strncpy((char *)((long)structure + 8),"array re",8);
            *(undefined8 *)((long)structure + 0xf) = 0x64657269757165;
            return 0x30;
          }
          piVar8 = *(int **)pzVar6->data;
          if ((piVar8 != (int *)0x0) && (0 < *piVar8)) {
            sVar18 = pzVar5[uVar24].offset;
            lVar22 = 0;
            do {
              uVar1 = *(uint *)(*(long *)(piVar8 + 2) + lVar22 * 4);
              if (0xff < uVar1) goto LAB_00102029;
              *(char *)(sVar18 + lVar23 + lVar22) = (char)uVar1;
              lVar22 = lVar22 + 1;
            } while (lVar22 < *piVar8);
          }
        }
        break;
      case zttype_ucharptr:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00102067;
          if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00102099;
          uVar1 = (((pzVar6->data).value)->data).integer;
          if (0xff < uVar1) goto LAB_00102029;
          **(undefined1 **)(lVar23 + pzVar5[uVar24].offset) = (char)uVar1;
        }
        else {
          if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_0010207d;
          piVar8 = *(int **)pzVar6->data;
          if ((piVar8 != (int *)0x0) && (0 < *piVar8)) {
            lVar22 = *(long *)(lVar23 + pzVar5[uVar24].offset);
            lVar19 = 0;
            do {
              uVar1 = *(uint *)(*(long *)(piVar8 + 2) + lVar19 * 4);
              if (0xff < uVar1) goto LAB_00102029;
              *(char *)(lVar22 + lVar19) = (char)uVar1;
              lVar19 = lVar19 + 1;
            } while (lVar19 < *piVar8);
          }
        }
        break;
      case zttype_ushort:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00102067;
          if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00102099;
          uVar1 = (((pzVar6->data).value)->data).integer;
          if (0xffff < uVar1) goto LAB_00102029;
          *(short *)(lVar23 + pzVar5[uVar24].offset) = (short)uVar1;
        }
        else {
          if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_0010207d;
          zVar21 = *(pzVar6->data).value;
          if ((zVar21 != (ztast_value)0x0) && (iVar9 = *(int *)zVar21, 0 < (long)iVar9)) {
            sVar18 = pzVar5[uVar24].offset;
            lVar22 = *(long *)((long)zVar21 + 8);
            lVar19 = 0;
            do {
              uVar1 = *(uint *)(lVar22 + lVar19 * 4);
              if (0xffff < uVar1) goto LAB_00102029;
              *(short *)(sVar18 + lVar23 + lVar19 * 2) = (short)uVar1;
              lVar19 = lVar19 + 1;
            } while (iVar9 != lVar19);
          }
        }
        break;
      case zttype_ushortptr:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00102067;
          if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00102099;
          uVar1 = (((pzVar6->data).value)->data).integer;
          if (0xffff < uVar1) goto LAB_00102029;
          **(undefined2 **)(lVar23 + pzVar5[uVar24].offset) = (short)uVar1;
        }
        else {
          if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_0010207d;
          zVar21 = *(pzVar6->data).value;
          if ((zVar21 != (ztast_value)0x0) && (iVar9 = *(int *)zVar21, 0 < (long)iVar9)) {
            lVar22 = *(long *)(lVar23 + pzVar5[uVar24].offset);
            lVar19 = *(long *)((long)zVar21 + 8);
            lVar20 = 0;
            do {
              uVar1 = *(uint *)(lVar19 + lVar20 * 4);
              if (0xffff < uVar1) goto LAB_00102029;
              *(short *)(lVar22 + lVar20 * 2) = (short)uVar1;
              lVar20 = lVar20 + 1;
            } while (iVar9 != lVar20);
          }
        }
        break;
      case zttype_uint:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00102067;
          if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00102099;
          zVar10 = ((pzVar6->data).value)->data;
LAB_00101c18:
          *(ztast_value_data *)(lVar23 + pzVar5[uVar24].offset) = zVar10;
        }
        else {
          if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_0010207d;
          piVar8 = *(int **)pzVar6->data;
          if ((piVar8 != (int *)0x0) && (0 < *piVar8)) {
            sVar18 = pzVar5[uVar24].offset;
            lVar22 = *(long *)(piVar8 + 2);
            lVar19 = 0;
            do {
              *(undefined4 *)(sVar18 + lVar23 + lVar19 * 4) = *(undefined4 *)(lVar22 + lVar19 * 4);
              lVar19 = lVar19 + 1;
            } while (lVar19 < *piVar8);
          }
        }
        break;
      case zttype_uintptr:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_VALUE) goto LAB_00102067;
          if (((pzVar6->data).value)->type != ZTVAL_INTEGER) goto LAB_00102099;
          **(ztast_value_data **)(lVar23 + pzVar5[uVar24].offset) = ((pzVar6->data).value)->data;
        }
        else {
          if (pzVar6->type != ZTEXPR_INTARRAY) goto LAB_0010207d;
          piVar8 = *(int **)pzVar6->data;
          if ((piVar8 != (int *)0x0) && (0 < *piVar8)) {
            lVar22 = *(long *)(lVar23 + pzVar5[uVar24].offset);
            lVar19 = *(long *)(piVar8 + 2);
            lVar20 = 0;
            do {
              *(undefined4 *)(lVar22 + lVar20 * 4) = *(undefined4 *)(lVar19 + lVar20 * 4);
              lVar20 = lVar20 + 1;
            } while (lVar20 < *piVar8);
          }
        }
        break;
      case zttype_struct:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_SCOPE) {
LAB_001020be:
            *(undefined8 *)((long)structure + 7) = 0x64657269757165;
            uVar15 = 0x65722065706f6373;
LAB_0010205e:
            *(undefined8 *)structure = uVar15;
            return 0x30;
          }
          iVar9 = (int)pzVar5[uVar24].offset + nloaders;
          zVar21 = *(pzVar6->data).value;
          meta_00 = pzVar5[uVar24].metadata;
LAB_00101bb9:
          iVar9 = zt_run_statements((ztast_statement_t *)zVar21,meta_00,regions,nregions,loaders,
                                    iVar9,structure,in_stack_ffffffffffffff90);
          goto LAB_00101bcf;
        }
        if (pzVar6->type != ZTEXPR_SCOPEARRAY) {
LAB_001020a2:
          *(undefined8 *)structure = 0x72612065706f6373;
          builtin_strncpy((char *)((long)structure + 8),"ray requ",8);
          *(undefined8 *)((long)structure + 0xd) = 0x64657269757165;
          return 0x30;
        }
        piVar8 = *(int **)pzVar6->data;
        if (piVar8 == (int *)0x0) goto LAB_00102067;
        if (0 < *piVar8) {
          sVar18 = pzVar5[uVar24].offset;
          lVar22 = 0;
          do {
            zVar11 = zt_run_statements((ztast_statement_t *)
                                       **(undefined8 **)(*(long *)(piVar8 + 2) + lVar22 * 8),
                                       pzVar5[uVar24].metadata,regions,nregions,loaders,
                                       (int)pzVar5[uVar24].size * (int)lVar22 +
                                       (int)sVar18 + nloaders,structure,in_stack_ffffffffffffff90);
            if (zVar11 != 0) {
              return zVar11;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < *piVar8);
        }
        break;
      case zttype_structptr:
        pzVar6 = pzVar4->expr;
        if (pzVar5[uVar24].nelems == 1) {
          if (pzVar6->type != ZTEXPR_SCOPE) goto LAB_001020be;
          meta_00 = pzVar5[uVar24].metadata;
          iVar9 = (int)*(undefined8 *)(lVar23 + pzVar5[uVar24].offset);
          zVar21 = *(pzVar6->data).value;
          goto LAB_00101bb9;
        }
        if (pzVar6->type != ZTEXPR_SCOPEARRAY) goto LAB_001020a2;
        piVar8 = *(int **)pzVar6->data;
        if (piVar8 == (int *)0x0) goto LAB_00102067;
        if (0 < *piVar8) {
          uVar15 = *(undefined8 *)(lVar23 + pzVar5[uVar24].offset);
          lVar22 = 0;
          do {
            zVar11 = zt_run_statements((ztast_statement_t *)
                                       **(undefined8 **)(*(long *)(piVar8 + 2) + lVar22 * 8),
                                       pzVar5[uVar24].metadata,regions,nregions,loaders,
                                       (int)pzVar5[uVar24].size * (int)lVar22 + (int)uVar15,
                                       structure,in_stack_ffffffffffffff90);
            if (zVar11 != 0) {
              return zVar11;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < *piVar8);
        }
        break;
      case zttype_staticarrayidx:
        if (pzVar5[uVar24].nelems != 1) {
LAB_0010200e:
          *(undefined8 *)structure = 0x726f707075736e75;
          *(undefined4 *)((long)structure + 8) = 0x646574;
          return 0x30;
        }
        pzVar16 = pzVar5[uVar24].array;
        uVar13 = pzVar16->length / (ulong)(long)pzVar16->nelems;
        if (pzVar4->expr->type != ZTEXPR_VALUE) goto LAB_00102067;
        sVar18 = pzVar5[uVar24].offset;
        pzVar7 = (pzVar4->expr->data).value;
        zVar2 = pzVar7->type;
        if (zVar2 == ZTVAL_NIL) goto LAB_00101feb;
        if (zVar2 != ZTVAL_INTEGER) {
LAB_00102106:
          *(undefined8 *)structure = 0x7463657078656e75;
          builtin_strncpy((char *)((long)structure + 8),"ed value",8);
          uVar15 = 0x65707974206575;
          goto LAB_001020ee;
        }
        iVar9 = (pzVar7->data).integer;
        lVar22 = (long)iVar9;
        if ((lVar22 < 0) || (pzVar16->nelems <= iVar9)) goto LAB_00102029;
LAB_00101fe2:
        pvVar14 = (void *)(uVar13 * lVar22 + (long)pzVar16->base);
        goto LAB_00101fed;
      case zttype_arrayidx:
        if (nregions < 1) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          pzVar17 = regions;
          while (pzVar5[uVar24].regionid != pzVar17->id) {
            uVar12 = uVar12 + 1;
            pzVar17 = pzVar17 + 1;
            if ((uint)nregions == uVar12) goto LAB_00102046;
          }
        }
        if ((int)uVar12 == nregions) {
LAB_00102046:
          *(undefined8 *)((long)structure + 7) = 0x6e6f6967657220;
          uVar15 = 0x206e776f6e6b6e75;
          goto LAB_0010205e;
        }
        uVar12 = uVar12 & 0xffffffff;
        iVar9 = regions[uVar12].spec.nelems;
        uVar13 = regions[uVar12].spec.length / (ulong)(long)iVar9;
        if (pzVar5[uVar24].nelems != 1) goto LAB_0010200e;
        if (pzVar4->expr->type != ZTEXPR_VALUE) goto LAB_00102067;
        sVar18 = pzVar5[uVar24].offset;
        pzVar7 = (pzVar4->expr->data).value;
        zVar2 = pzVar7->type;
        if (zVar2 != ZTVAL_NIL) {
          if (zVar2 != ZTVAL_INTEGER) goto LAB_00102106;
          iVar3 = (pzVar7->data).integer;
          lVar22 = (long)iVar3;
          if ((lVar22 < 0) || (iVar9 <= iVar3)) goto LAB_00102029;
          pzVar16 = &regions[uVar12].spec;
          goto LAB_00101fe2;
        }
LAB_00101feb:
        pvVar14 = (void *)0x0;
LAB_00101fed:
        *(void **)(lVar23 + sVar18) = pvVar14;
        break;
      case zttype_version:
        if (pzVar5[uVar24].nelems != 1) goto LAB_0010200e;
        if (pzVar4->expr->type != ZTEXPR_VALUE) goto LAB_00102067;
        pzVar7 = (pzVar4->expr->data).value;
        if (pzVar7->type == ZTVAL_DECIMAL) {
          zVar10 = pzVar7->data;
          if (999 < (uint)zVar10) goto LAB_00102029;
          goto LAB_00101c18;
        }
        uVar26._0_1_ = 'd';
        uVar26._1_1_ = 'e';
        uVar26._2_1_ = 'c';
        uVar26._3_1_ = 'i';
        uVar27._0_1_ = 'm';
        uVar27._1_1_ = 'a';
        uVar27._2_1_ = 'l';
        uVar27._3_1_ = ' ';
LAB_001020df:
        *(undefined4 *)structure = uVar26;
        *(undefined4 *)((long)structure + 4) = uVar27;
        builtin_strncpy((char *)((long)structure + 8),"type",4);
        builtin_strncpy((char *)((long)structure + 0xc)," req",4);
        uVar15 = 0x64657269757165;
LAB_001020ee:
        *(undefined8 *)((long)structure + 0xe) = uVar15;
        return 0x30;
      case zttype_custom:
        if (pzVar5[uVar24].nelems != 1) goto LAB_0010200e;
        iVar9 = (*loaders[pzVar5[uVar24].typeidx])
                          (pzVar4->expr,(void *)(pzVar5[uVar24].offset + lVar23),(char *)structure);
LAB_00101bcf:
        if (iVar9 != 0) {
          return iVar9;
        }
      }
      statements = statements->next;
    } while (statements != (ztast_statement *)0x0);
  }
  return 0;
}

Assistant:

static ztresult_t zt_run_statements(const ztast_statement_t *statements,
                                    const ztstruct_t        *meta,
                                    const ztregion_t        *regions,
                                    int                      nregions,
                                    ztloader_t             **loaders,
                                    int                      nloaders,
                                    void                    *structure,
                                    char                    *errbuf)
{
  ztresult_t               rc;
  const ztast_statement_t *statement;

  for (statement = statements; statement; statement = statement->next)
  {
    switch (statement->type)
    {
    case ZTSTMT_ASSIGNMENT:
      rc = zt_do_assignment(statement->u.assignment,
                            meta,
                            regions,
                            nregions,
                            loaders,
                            nloaders,
                            structure,
                            errbuf);
      if (rc)
        return rc;
      break;

    default:
      return zt_mksyntax(errbuf, ztsyntx_UNSUPPORTED);
    }
  }

  return ztresult_OK;
}